

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

bool __thiscall
MlmWrap::checkBrokerConnected(MlmWrap *this,char *endpoint,int tries,mlm_client_t *temp,int timeout)

{
  int iVar1;
  ulong uVar2;
  undefined8 in_RCX;
  int in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  bool bVar3;
  int rc;
  bool retval;
  int local_1c;
  bool local_1;
  
  uVar2 = mlm_client_connected(in_RCX);
  local_1c = in_EDX;
  if ((uVar2 & 1) == 0) {
    while( true ) {
      iVar1 = mlm_client_connect(in_RCX,in_RSI,1000,"temp");
      bVar3 = false;
      if (iVar1 < 0) {
        local_1c = local_1c + -1;
        bVar3 = local_1c != 0;
      }
      if (!bVar3) break;
      zclock_sleep(100);
    }
    local_1 = iVar1 == 0;
    *(bool *)(in_RDI + 0x91) = local_1;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool MlmWrap::checkBrokerConnected(const char *endpoint, int tries, mlm_client_t* temp, int timeout) {
    bool retval = false;
    int rc = -1;

    if(mlm_client_connected(temp)) //Passed in temp is already connected and verified
        return true;
    while((rc = mlm_client_connect(temp, endpoint, 1000, TEMP_NETWORK_ID)) < 0 && --tries){
        zclock_sleep(100);
    }
    if (rc == 0) {
        retval = true;
    }
    else {
        retval = false;
    }
    connected = retval;
    return(retval);
}